

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O0

bool __thiscall KVStore::del(KVStore *this,uint64_t key)

{
  ulong uVar1;
  bool bVar2;
  allocator local_79;
  string local_78 [52];
  undefined4 local_44;
  string local_40 [8];
  string value;
  uint64_t key_local;
  KVStore *this_local;
  
  (*(this->super_KVStoreAPI)._vptr_KVStoreAPI[1])(local_40,this,key);
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) == 0;
  if (bVar2) {
    SkipList::remove(&this->memTable,(char *)key);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"~DELETED~",&local_79);
    SkipList::put(&this->memTable,key,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_44 = 1;
  std::__cxx11::string::~string(local_40);
  return bVar2;
}

Assistant:

bool KVStore::del(uint64_t key) {
  auto value = get(key);
  if (value.empty()) return false;
  memTable.remove(key);
  memTable.put(key, "~DELETED~");
  return true;
}